

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd2topng.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int local_40;
  int local_3c;
  int h;
  int w;
  int y;
  int x;
  FILE *out;
  FILE *in;
  gdImagePtr im;
  char **argv_local;
  int argc_local;
  
  w = 0;
  h = 0;
  local_3c = 0;
  local_40 = 0;
  if ((argc != 3) && (argc != 7)) {
    fprintf(_stderr,"Usage: gd2topng filename.gd2 filename.png [srcx srcy width height]\n");
    fprintf(_stderr,"If the coordinates are absent,t he entire image is converted.\n");
    exit(1);
  }
  if (argc == 7) {
    w = atoi(argv[3]);
    h = atoi(argv[4]);
    local_3c = atoi(argv[5]);
    local_40 = atoi(argv[6]);
  }
  pFVar1 = fopen(argv[1],"rb");
  if (pFVar1 == (FILE *)0x0) {
    fprintf(_stderr,"Input file does not exist!\n");
    exit(1);
  }
  if (argc == 7) {
    in = (FILE *)gdImageCreateFromGd2Part(pFVar1,w,h,local_3c,local_40);
  }
  else {
    in = (FILE *)gdImageCreateFromGd2(pFVar1);
  }
  fclose(pFVar1);
  if (in == (FILE *)0x0) {
    fprintf(_stderr,"Input is not in GD2 format!\n");
    exit(1);
  }
  pFVar1 = fopen(argv[2],"wb");
  if (pFVar1 == (FILE *)0x0) {
    fprintf(_stderr,"Output file cannot be written to!\n");
    gdImageDestroy(in);
    exit(1);
  }
  fprintf(_stderr,"No PNG library support available.\n");
  fclose(pFVar1);
  gdImageDestroy(in);
  return 0;
}

Assistant:

int
main (int argc, char **argv)
{
	gdImagePtr im;
	FILE *in, *out;
	int x=0, y=0, w=0, h=0;
	if ((argc != 3) && (argc != 7)) {
		fprintf (stderr,
		         "Usage: gd2topng filename.gd2 filename.png [srcx srcy width height]\n");
		fprintf (stderr,
		         "If the coordinates are absent,t he entire image is converted.\n");
		exit (1);
	}
	if (argc == 7) {
		x = atoi (argv[3]);
		y = atoi (argv[4]);
		w = atoi (argv[5]);
		h = atoi (argv[6]);
	}
	in = fopen (argv[1], "rb");
	if (!in) {
		fprintf(stderr, "Input file does not exist!\n");
		exit (1);
	}
	if (argc == 7) {
		im = gdImageCreateFromGd2Part (in, x, y, w, h);
	} else {
		im = gdImageCreateFromGd2 (in);
	}
	fclose (in);
	if (!im) {
		fprintf(stderr, "Input is not in GD2 format!\n");
		exit (1);
	}
	out = fopen (argv[2], "wb");
	if (!out) {
		fprintf(stderr, "Output file cannot be written to!\n");
		gdImageDestroy (im);
		exit (1);
	}
#ifdef HAVE_LIBPNG
	gdImagePng (im, out);
#else
	fprintf(stderr, "No PNG library support available.\n");
#endif
	fclose (out);
	gdImageDestroy (im);

	return 0;
}